

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O2

int Wln_NtkDupDfs_rec(Wln_Ntk_t *pNew,Wln_Ntk_t *p,int iObj)

{
  int iVar1;
  int iObj_00;
  
  if (iObj == 0) {
    return 0;
  }
  iVar1 = Vec_IntEntry(&p->vCopies,iObj);
  if (iVar1 != 0) {
    iVar1 = Vec_IntEntry(&p->vCopies,iObj);
    return iVar1;
  }
  iVar1 = Wln_ObjIsFf(p,iObj);
  if (iVar1 == 0) {
    for (iVar1 = 0; iVar1 < p->vFanins[iObj].nSize; iVar1 = iVar1 + 1) {
      iObj_00 = Wln_ObjFanin(p,iObj,iVar1);
      if (iObj_00 != 0) {
        Wln_NtkDupDfs_rec(pNew,p,iObj_00);
      }
    }
    iVar1 = Wln_ObjDup(pNew,p,iObj);
    return iVar1;
  }
  __assert_fail("!Wln_ObjIsFf(p, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wln/wlnNtk.c"
                ,0x140,"int Wln_NtkDupDfs_rec(Wln_Ntk_t *, Wln_Ntk_t *, int)");
}

Assistant:

int Wln_NtkDupDfs_rec( Wln_Ntk_t * pNew, Wln_Ntk_t * p, int iObj )
{
    int i, iFanin;
    if ( iObj == 0 )
        return 0;
    if ( Wln_ObjCopy(p, iObj) )
        return Wln_ObjCopy(p, iObj);
    //printf( "Visiting node %16s (ID %6d) of type %5s (type ID %2d)\n", Wln_ObjName(p, iObj), iObj, Abc_OperName(Wln_ObjType(p, iObj)), Wln_ObjType(p, iObj) );
    assert( !Wln_ObjIsFf(p, iObj) );
    Wln_ObjForEachFanin( p, iObj, iFanin, i )
        Wln_NtkDupDfs_rec( pNew, p, iFanin );
    return Wln_ObjDup( pNew, p, iObj );
}